

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

int32_t __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
::decode_run_pixels(jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
                    *this,pixel_type ra,pixel_type *start_pos,int32_t pixel_count)

{
  undefined2 uVar1;
  anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5 aVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar13;
  
  iVar10 = 0;
  uVar1 = ra._0_2_;
  do {
    bVar4 = decoder_strategy::read_bit(&this->super_decoder_strategy);
    if (!bVar4) {
      if (pixel_count != iVar10) {
        if (*(int32_t *)(J + (long)this->run_index_ * 4) < 1) {
          iVar5 = 0;
        }
        else {
          iVar5 = decoder_strategy::read_value
                            (&this->super_decoder_strategy,
                             *(int32_t *)(J + (long)this->run_index_ * 4));
        }
        bVar4 = pixel_count < iVar5 + iVar10;
        pixel_count = iVar5 + iVar10;
        if (bVar4) {
          jls_codec<charls::default_traits<unsigned_char,charls::triplet<unsigned_char>>,charls::decoder_strategy>
          ::decode_run_pixels();
LAB_001140b0:
          __assert_fail("index <= pixel_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                        ,0x2d2,
                        "int32_t charls::jls_codec<charls::default_traits<unsigned char, charls::triplet<unsigned char>>, charls::decoder_strategy>::decode_run_pixels(pixel_type, pixel_type *, const int32_t) [Traits = charls::default_traits<unsigned char, charls::triplet<unsigned char>>, Strategy = charls::decoder_strategy]"
                       );
        }
      }
      break;
    }
    iVar5 = this->run_index_;
    iVar8 = 1 << (J[(long)iVar5 * 4] & 0x1f);
    iVar7 = pixel_count - iVar10;
    iVar9 = iVar8;
    if (iVar7 < iVar8) {
      iVar9 = iVar7;
    }
    iVar10 = iVar10 + iVar9;
    if (pixel_count < iVar10) goto LAB_001140b0;
    if (iVar8 <= iVar7) {
      if (0x1d < iVar5) {
        iVar5 = 0x1e;
      }
      this->run_index_ = iVar5 + 1;
    }
  } while (iVar10 != pixel_count);
  auVar3 = _DAT_00126960;
  if (0 < pixel_count) {
    lVar6 = (ulong)(uint)pixel_count - 1;
    auVar11._8_4_ = (int)lVar6;
    auVar11._0_8_ = lVar6;
    auVar11._12_4_ = (int)((ulong)lVar6 >> 0x20);
    lVar6 = 0;
    auVar11 = auVar11 ^ _DAT_00126960;
    aVar2 = ra.field_2;
    auVar12 = _DAT_00126940;
    auVar14 = _DAT_00126950;
    do {
      auVar15 = auVar14 ^ auVar3;
      iVar10 = auVar11._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar10 && auVar11._0_4_ < auVar15._0_4_ ||
                  iVar10 < auVar15._4_4_) & 1)) {
        *(undefined2 *)(&start_pos->field_0 + lVar6) = uVar1;
        (&start_pos->field_2)[lVar6].v3 = (uchar)aVar2;
      }
      if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
          auVar15._12_4_ <= auVar11._12_4_) {
        *(undefined2 *)(&start_pos[1].field_0 + lVar6) = uVar1;
        (&start_pos[1].field_2)[lVar6].v3 = (uchar)aVar2;
      }
      auVar15 = auVar12 ^ auVar3;
      iVar5 = auVar15._4_4_;
      if (iVar5 <= iVar10 && (iVar5 != iVar10 || auVar15._0_4_ <= auVar11._0_4_)) {
        *(undefined2 *)(&start_pos[2].field_0 + lVar6) = uVar1;
        (&start_pos[2].field_2)[lVar6].v3 = (uchar)aVar2;
        *(undefined2 *)(&start_pos[3].field_0 + lVar6) = uVar1;
        (&start_pos[3].field_2)[lVar6].v3 = (uchar)aVar2;
      }
      lVar13 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 4;
      auVar14._8_8_ = lVar13 + 4;
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar13 + 4;
      lVar6 = lVar6 + 0xc;
    } while ((ulong)(pixel_count + 3U & 0xfffffffc) * 3 != lVar6);
  }
  return pixel_count;
}

Assistant:

int32_t decode_run_pixels(pixel_type ra, pixel_type* start_pos, const int32_t pixel_count)
    {
        int32_t index{};
        while (Strategy::read_bit())
        {
            const int count{std::min(1 << J[run_index_], pixel_count - index)};
            index += count;
            ASSERT(index <= pixel_count);

            if (count == (1 << J[run_index_]))
            {
                increment_run_index();
            }

            if (index == pixel_count)
                break;
        }

        if (index != pixel_count)
        {
            // incomplete run.
            index += (J[run_index_] > 0) ? Strategy::read_value(J[run_index_]) : 0;
        }

        if (UNLIKELY(index > pixel_count))
            impl::throw_jpegls_error(jpegls_errc::invalid_encoded_data);

        for (int32_t i{}; i < index; ++i)
        {
            start_pos[i] = ra;
        }

        return index;
    }